

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O0

void av1_compute_stats_avx2
               (int wiener_win,uint8_t *dgd,uint8_t *src,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,int use_downsampled_wiener_stats)

{
  undefined8 unaff_RBP;
  int in_EDI;
  int16_t *unaff_R15;
  uint8_t unaff_retaddr;
  int32_t unaff_retaddr_00;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  int in_stack_00000030;
  int64_t *in_stack_00000038;
  int32_t in_stack_00000040;
  int32_t s_stride;
  int32_t d_stride;
  int32_t height;
  int32_t width;
  uint8_t avg;
  int32_t wiener_halfwin;
  int32_t in_stack_000000e4;
  undefined4 in_stack_000000fc;
  int in_stack_000016bc;
  int32_t in_stack_000016c0;
  int32_t in_stack_000016c4;
  int16_t *in_stack_000016c8;
  int32_t in_stack_000016d4;
  int16_t *in_stack_000016d8;
  int in_stack_000020fc;
  int32_t in_stack_00002100;
  int32_t in_stack_00002104;
  int16_t *in_stack_00002108;
  int32_t in_stack_00002114;
  int16_t *in_stack_00002118;
  int in_stack_000025dc;
  int16_t *in_stack_000025e0;
  int16_t *in_stack_000025e8;
  uint8_t *in_stack_000025f0;
  uint8_t *in_stack_000025f8;
  int in_stack_00002604;
  int in_stack_00002620;
  int in_stack_00002628;
  int in_stack_00002630;
  int in_stack_00002638;
  int in_stack_00002640;
  int64_t *in_stack_00002648;
  int64_t *in_stack_00002650;
  int in_stack_00002658;
  int in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  
  if ((in_EDI == 7) || (in_EDI == 5)) {
    calc_dgd_buf_avg_avx2
              ((uint8_t *)CONCAT44(in_stack_000000fc,use_downsampled_wiener_stats),H._4_4_,
               (int32_t)H,M._4_4_,(int32_t)M,in_stack_000000e4);
    sub_avg_block_avx2((uint8_t *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,
                       unaff_retaddr,(int32_t)((ulong)unaff_RBP >> 0x20),(int32_t)unaff_RBP,
                       unaff_R15,in_stack_00000040,in_stack_ffffffffffffff58);
    sub_avg_block_avx2((uint8_t *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,
                       unaff_retaddr,(int32_t)((ulong)unaff_RBP >> 0x20),(int32_t)unaff_RBP,
                       unaff_R15,0,in_stack_ffffffffffffff58);
    if (in_EDI == 7) {
      compute_stats_win7_avx2
                (in_stack_00002118,in_stack_00002114,in_stack_00002108,in_stack_00002104,
                 in_stack_00002100,in_stack_000020fc,in_stack_00000030,in_stack_00000038,
                 (int64_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_00000040),
                 in_stack_ffffffffffffff68);
    }
    else if (in_EDI == 5) {
      compute_stats_win5_avx2
                (in_stack_000016d8,in_stack_000016d4,in_stack_000016c8,in_stack_000016c4,
                 in_stack_000016c0,in_stack_000016bc,in_stack_00000030,in_stack_00000038,
                 (int64_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_00000040),
                 in_stack_ffffffffffffff68);
    }
  }
  else {
    av1_compute_stats_c(in_stack_00002604,in_stack_000025f8,in_stack_000025f0,in_stack_000025e8,
                        in_stack_000025e0,in_stack_000025dc,in_stack_00002620,in_stack_00002628,
                        in_stack_00002630,in_stack_00002638,in_stack_00002640,in_stack_00002648,
                        in_stack_00002650,in_stack_00002658);
  }
  return;
}

Assistant:

void av1_compute_stats_avx2(int wiener_win, const uint8_t *dgd,
                            const uint8_t *src, int16_t *dgd_avg,
                            int16_t *src_avg, int h_start, int h_end,
                            int v_start, int v_end, int dgd_stride,
                            int src_stride, int64_t *M, int64_t *H,
                            int use_downsampled_wiener_stats) {
  if (wiener_win != WIENER_WIN && wiener_win != WIENER_WIN_CHROMA) {
    // Currently, libaom supports Wiener filter processing with window sizes as
    // WIENER_WIN_CHROMA(5) and WIENER_WIN(7). For any other window size, SIMD
    // support is not facilitated. Hence, invoke C function for the same.
    av1_compute_stats_c(wiener_win, dgd, src, dgd_avg, src_avg, h_start, h_end,
                        v_start, v_end, dgd_stride, src_stride, M, H,
                        use_downsampled_wiener_stats);
    return;
  }

  const int32_t wiener_halfwin = wiener_win >> 1;
  const uint8_t avg =
      calc_dgd_buf_avg_avx2(dgd, h_start, h_end, v_start, v_end, dgd_stride);
  const int32_t width = h_end - h_start;
  const int32_t height = v_end - v_start;
  const int32_t d_stride = (width + 2 * wiener_halfwin + 15) & ~15;
  const int32_t s_stride = (width + 15) & ~15;

  // Based on the sf 'use_downsampled_wiener_stats', process either once for
  // UPDATE_DOWNSAMPLE_FACTOR or for each row.
  sub_avg_block_avx2(src + v_start * src_stride + h_start, src_stride, avg,
                     width, height, src_avg, s_stride,
                     use_downsampled_wiener_stats);

  // Compute (dgd-avg) buffer here which is used to fill H buffer.
  sub_avg_block_avx2(
      dgd + (v_start - wiener_halfwin) * dgd_stride + h_start - wiener_halfwin,
      dgd_stride, avg, width + 2 * wiener_halfwin, height + 2 * wiener_halfwin,
      dgd_avg, d_stride, 0);
  if (wiener_win == WIENER_WIN) {
    compute_stats_win7_avx2(dgd_avg, d_stride, src_avg, s_stride, width,
                            v_start, v_end, M, H, use_downsampled_wiener_stats);
  } else if (wiener_win == WIENER_WIN_CHROMA) {
    compute_stats_win5_avx2(dgd_avg, d_stride, src_avg, s_stride, width,
                            v_start, v_end, M, H, use_downsampled_wiener_stats);
  }
}